

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<utGenBoundingBoxesProcess_executeTest_Test>::CreateTest
          (TestFactoryImpl<utGenBoundingBoxesProcess_executeTest_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x28);
  utGenBoundingBoxesProcess_executeTest_Test::utGenBoundingBoxesProcess_executeTest_Test
            ((utGenBoundingBoxesProcess_executeTest_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }